

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bninchrr(bstring b0,int pos,bstring b1)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  unsigned_long uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  charField chrs;
  charField local_60;
  
  if ((((b0 != (bstring)0x0 && -1 < pos) && (puVar3 = b0->data, puVar3 != (uchar *)0x0)) &&
      (iVar2 = b0->slen, pos <= iVar2)) && (iVar8 = buildCharField(&local_60,b1), -1 < iVar8)) {
    uVar10 = pos - (uint)(iVar2 == pos);
    lVar9 = 0;
    do {
      uVar5 = *(uint *)((long)local_60.content + lVar9 * 8 + 4);
      uVar7 = local_60.content[lVar9 + 1];
      uVar6 = *(uint *)((long)local_60.content + lVar9 * 8 + 0xc);
      *(uint *)(local_60.content + lVar9) = (uint)local_60.content[lVar9] ^ 0xffffffff;
      *(uint *)((long)local_60.content + lVar9 * 8 + 4) = uVar5 ^ 0xffffffff;
      *(uint *)(local_60.content + lVar9 + 1) = (uint)uVar7 ^ 0xffffffff;
      *(uint *)((long)local_60.content + lVar9 * 8 + 0xc) = uVar6 ^ 0xffffffff;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 8);
    if (-1 < (int)uVar10) {
      do {
        bVar1 = puVar3[uVar10];
        if (((uint)local_60.content[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) != 0) {
          return uVar10;
        }
        bVar4 = 0 < (int)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar4);
    }
  }
  return -1;
}

Assistant:

int bninchrr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL || 
	    b0->slen < pos) return BSTR_ERR;
	if (pos == b0->slen) pos--;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	invertCharField (&chrs);
	return binchrrCF (b0->data, pos, &chrs);
}